

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::ModuleDeclarationSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0x157) {
    if ((kind != InterfaceDeclaration) && (kind != ModuleDeclaration)) {
      return false;
    }
  }
  else if ((kind != PackageDeclaration) && (kind != ProgramDeclaration)) {
    return false;
  }
  return true;
}

Assistant:

bool ModuleDeclarationSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::PackageDeclaration:
        case SyntaxKind::ProgramDeclaration:
            return true;
        default:
            return false;
    }
}